

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForAnyEvent(double *timeout)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  pollfd_conflict fds [3];
  
  fds[0].fd = *(int *)(_glfw.x11.display + 0x10);
  fds[0].events = 1;
  fds[0].revents = 0;
  fds[1].fd = _glfw.x11.emptyEventPipe[0];
  fds[1].events = 1;
  fds[1].revents = 0;
  fds[2].fd = -1;
  fds[2].events = 1;
  fds[2].revents = 0;
  uVar2 = fds[0]._4_4_;
  if (_glfw.joysticksInitialized != 0) {
    fds[2].fd = _glfw.linjs.inotify;
    fds[1].events = 1;
    fds[1].revents = 0;
    uVar2 = fds[2]._4_4_;
  }
  while( true ) {
    fds[2]._4_4_ = uVar2;
    uVar3 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) break;
    uVar3 = _glfwPollPOSIX(fds,3,timeout);
    uVar4 = (ulong)uVar3;
    if (uVar3 == 0) break;
    uVar4 = 0;
    while (uVar2 = fds[2]._4_4_, uVar4 != 2) {
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      if ((fds[lVar1].revents & 1) != 0) goto LAB_001aca18;
    }
  }
LAB_001aca18:
  return (GLFWbool)uVar4;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    enum { XLIB_FD, PIPE_FD, INOTIFY_FD };
    struct pollfd fds[] =
    {
        [XLIB_FD] = { ConnectionNumber(_glfw.x11.display), POLLIN },
        [PIPE_FD] = { _glfw.x11.emptyEventPipe[0], POLLIN },
        [INOTIFY_FD] = { -1, POLLIN }
    };

#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        fds[INOTIFY_FD].fd = _glfw.linjs.inotify;
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
            return GLFW_FALSE;

        for (int i = 1; i < sizeof(fds) / sizeof(fds[0]); i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}